

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O2

void __thiscall
testing::internal::StreamingListener::SocketWriter::~SocketWriter(SocketWriter *this)

{
  (this->super_AbstractSocketWriter)._vptr_AbstractSocketWriter =
       (_func_int **)&PTR__SocketWriter_00157c48;
  if (this->sockfd_ != -1) {
    CloseConnection(this);
  }
  std::__cxx11::string::~string((string *)&this->port_num_);
  std::__cxx11::string::~string((string *)&this->host_name_);
  return;
}

Assistant:

virtual ~SocketWriter() {
      if (sockfd_ != -1)
        CloseConnection();
    }